

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

void chaiscript::bootstrap::construct_pod<char32_t>(string *type,Module *m)

{
  string local_50;
  anon_class_1_0_00000001_for_m_f local_29;
  Proxy_Function local_28;
  Module *local_18;
  Module *m_local;
  string *type_local;
  
  local_18 = m;
  m_local = (Module *)type;
  fun<chaiscript::bootstrap::construct_pod<char32_t>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(chaiscript::Boxed_Number_const&)_1_>
            ((chaiscript *)&local_28,&local_29);
  std::__cxx11::string::string
            ((string *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)m_local);
  Module::add(m,&local_28,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_28);
  return;
}

Assistant:

void construct_pod(const std::string &type, Module &m) {
    m.add(fun([](const Boxed_Number &bn) { return bn.get_as<T>(); }), type);
  }